

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  long lVar1;
  string *s;
  
  std::operator<<(param_3,'{');
  s = (string *)*param_2;
  lVar1 = 0;
  do {
    if (s == (string *)param_2[1]) {
      if (lVar1 != 0) {
LAB_00119505:
        std::operator<<(param_3,' ');
      }
      std::operator<<(param_3,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(param_3,','), lVar1 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_00119505;
    }
    std::operator<<(param_3,' ');
    PrintStringTo(s,param_3);
    s = s + 1;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}